

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O1

string * __thiscall
clask::request::cookie_value(string *__return_storage_ptr__,request *this,string *name)

{
  pointer pcVar1;
  size_t sVar2;
  pointer pbVar3;
  int iVar4;
  long lVar5;
  string *psVar6;
  pointer ppVar7;
  pointer pbVar8;
  pointer ppVar9;
  bool bVar10;
  string value;
  string path;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  toks;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> v;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  elems;
  pointer local_128;
  size_type local_120;
  char local_118;
  undefined7 uStack_117;
  undefined8 uStack_110;
  long *local_108 [2];
  long local_f8 [2];
  string *local_e8;
  request *local_e0;
  string *local_d8;
  undefined1 *local_d0;
  size_t local_c8;
  undefined1 local_c0;
  undefined7 uStack_bf;
  long *local_b0;
  long local_a8;
  long local_a0 [2];
  string local_90;
  pointer local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  local_128 = &local_118;
  local_120 = 0;
  local_118 = '\0';
  local_d0 = &local_c0;
  local_c8 = 0;
  local_c0 = 0;
  ppVar7 = (this->headers).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar9 = (this->headers).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_e8 = __return_storage_ptr__;
  local_e0 = this;
  local_d8 = name;
  if (ppVar7 != ppVar9) {
    local_e0 = (request *)&this->uri;
    local_70 = ppVar9;
    do {
      iVar4 = std::__cxx11::string::compare((char *)ppVar7);
      if (iVar4 == 0) {
        split_string(&local_68,&ppVar7->second,';',0xffffffffffffffff);
        pbVar3 = local_68.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (local_68.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_68.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          bVar10 = false;
          pbVar8 = local_68.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          do {
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            pcVar1 = (pbVar8->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_90,pcVar1,pcVar1 + pbVar8->_M_string_length);
            local_108[0] = local_f8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_108," \t\v\r\n","");
            lVar5 = std::__cxx11::string::find_first_not_of((char *)&local_90,(ulong)local_108[0],0)
            ;
            if (lVar5 != -1) {
              std::__cxx11::string::find_last_not_of
                        ((char *)&local_90,(ulong)local_108[0],0xffffffffffffffff);
              std::__cxx11::string::substr((ulong)&local_b0,(ulong)&local_90);
              std::__cxx11::string::operator=((string *)&local_90,(string *)&local_b0);
              if (local_b0 != local_a0) {
                operator_delete(local_b0,local_a0[0] + 1);
              }
            }
            if (local_108[0] != local_f8) {
              operator_delete(local_108[0],local_f8[0] + 1);
            }
            split_string((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_b0,&local_90,'=',0xffffffffffffffff);
            if (local_a8 - (long)local_b0 == 0x40) {
              sVar2 = local_b0[1];
              if (sVar2 == local_d8->_M_string_length) {
                if (sVar2 != 0) {
                  iVar4 = bcmp((void *)*local_b0,(local_d8->_M_dataplus)._M_p,sVar2);
                  if (iVar4 != 0) goto LAB_00125e76;
                }
                bVar10 = true;
                std::__cxx11::string::_M_assign((string *)&local_128);
              }
            }
LAB_00125e76:
            if (local_a8 - (long)local_b0 == 0x40) {
              iVar4 = std::__cxx11::string::compare((char *)local_b0);
              if (iVar4 == 0) {
                std::__cxx11::string::_M_assign((string *)&local_d0);
              }
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
            }
            sVar2 = local_c8;
            pbVar8 = pbVar8 + 1;
          } while (pbVar8 != pbVar3);
          if (bVar10) {
            bVar10 = true;
            if (local_c8 != 0) {
              std::__cxx11::string::substr((ulong)&local_50,(ulong)local_e0);
              if (local_48 == local_c8) {
                if (local_48 != 0) {
                  iVar4 = bcmp(local_50,local_d0,local_48);
                  bVar10 = iVar4 == 0;
                }
              }
              else {
                bVar10 = false;
              }
            }
            if ((sVar2 != 0) && (local_50 != local_40)) {
              operator_delete(local_50,local_40[0] + 1);
            }
            psVar6 = local_e8;
            if (bVar10) {
              (local_e8->_M_dataplus)._M_p = (pointer)&local_e8->field_2;
              if (local_128 == &local_118) {
                (local_e8->field_2)._M_allocated_capacity = CONCAT71(uStack_117,local_118);
                *(undefined8 *)((long)&local_e8->field_2 + 8) = uStack_110;
              }
              else {
                (local_e8->_M_dataplus)._M_p = local_128;
                (local_e8->field_2)._M_allocated_capacity = CONCAT71(uStack_117,local_118);
              }
              local_e8->_M_string_length = local_120;
              local_120 = 0;
              local_118 = '\0';
              local_128 = &local_118;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_68);
              goto LAB_00125fcd;
            }
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_68);
        ppVar9 = local_70;
      }
      ppVar7 = ppVar7 + 1;
    } while (ppVar7 != ppVar9);
  }
  psVar6 = local_e8;
  (local_e8->_M_dataplus)._M_p = (pointer)&local_e8->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"");
LAB_00125fcd:
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128,CONCAT71(uStack_117,local_118) + 1);
  }
  return psVar6;
}

Assistant:

inline std::string request::cookie_value(const std::string& name) {
  std::string value, path;
  for (auto&& header : headers) {
    if (header.first == "Cookie") {
      auto elems = split_string(header.second, ';');
      auto found = false;
      for (auto&& elem : elems) {
        auto v = elem;
        trim_string(v);
        auto toks = split_string(v, '=');
        if (toks.size() == 2 && toks[0] == name) {
          value = toks[1];
          found = true;
        }
        if (toks.size() == 2 && toks[0] == "path") {
          path = toks[1];
        }
      }
      if (found) {
        if (path.empty() || uri.substr(path.size()) == path) {
          return value;
        }
      }
    }
  }
  return "";
}